

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

size_t __thiscall proto3_unittest::TestMessageWithDummy::ByteSizeLong(TestMessageWithDummy *this)

{
  size_t sVar1;
  
  sVar1 = 6;
  if (((this->field_0)._impl_.dummy_ & 1U) == 0) {
    sVar1 = 0;
  }
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    sVar1 = 0;
  }
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestMessageWithDummy::ByteSizeLong() const {
  const TestMessageWithDummy& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestMessageWithDummy)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // bool dummy = 536870911;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_dummy() != 0) {
        total_size += 6;
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}